

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

int glfwGetMouseButton(GLFWwindow *handle,int button)

{
  int iVar1;
  
  if (_glfw.initialized == 0) {
    iVar1 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((uint)button < 8) {
    iVar1 = (int)(char)handle[(ulong)(uint)button + 0x80];
    if (iVar1 == 3) {
      handle[(ulong)(uint)button + 0x80] = (GLFWwindow)0x0;
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 0;
    _glfwInputError(0x10003,"Invalid mouse button %i");
  }
  return iVar1;
}

Assistant:

GLFWAPI int glfwGetMouseButton(GLFWwindow* handle, int button)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_RELEASE);

    if (button < GLFW_MOUSE_BUTTON_1 || button > GLFW_MOUSE_BUTTON_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid mouse button %i", button);
        return GLFW_RELEASE;
    }

    if (window->mouseButtons[button] == _GLFW_STICK)
    {
        // Sticky mode: release mouse button now
        window->mouseButtons[button] = GLFW_RELEASE;
        return GLFW_PRESS;
    }

    return (int) window->mouseButtons[button];
}